

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  string *in_RDX;
  string *in_RSI;
  ulong in_RDI;
  size_type loc;
  string asStack_88 [32];
  string local_68 [32];
  string local_48 [32];
  long local_28;
  string *local_20;
  string *local_18;
  ulong local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar3 = ::std::__cxx11::string::size();
  if ((2 < uVar3) && (iVar2 = ::std::__cxx11::string::compare(local_10,0,(char *)0x2), iVar2 == 0))
  {
    pcVar4 = (char *)::std::__cxx11::string::operator[](local_10);
    bVar1 = valid_first_char<char>(*pcVar4);
    if (bVar1) {
      local_28 = ::std::__cxx11::string::find_first_of((char)local_10,0x3d);
      if (local_28 == -1) {
        ::std::__cxx11::string::substr((ulong)asStack_88,local_10);
        ::std::__cxx11::string::operator=(local_18,asStack_88);
        ::std::__cxx11::string::~string(asStack_88);
        ::std::__cxx11::string::operator=(local_20,"");
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_48,local_10);
        ::std::__cxx11::string::operator=(local_18,local_48);
        ::std::__cxx11::string::~string(local_48);
        ::std::__cxx11::string::substr((ulong)local_68,local_10);
        ::std::__cxx11::string::operator=(local_20,local_68);
        ::std::__cxx11::string::~string(local_68);
      }
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.compare(0, 2, "--") == 0 && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}